

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

StatusOr<double> __thiscall osqp::OsqpSolver::GetEpsRel(OsqpSolver *this)

{
  bool bVar1;
  pointer pOVar2;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *in_RSI;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 aVar3;
  StatusOr<double> SVar4;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Status local_20 [2];
  OsqpSolver *this_local;
  
  this_local = this;
  bVar1 = IsInitialized((OsqpSolver *)in_RSI);
  if (bVar1) {
    pOVar2 = std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::operator->
                       (in_RSI);
    absl::StatusOr<double>::StatusOr<double_&,_0>
              ((StatusOr<double> *)this,&((pOVar2->super_OSQPWorkspace).settings)->eps_rel);
    aVar3 = extraout_XMM0_Qa_00;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"OsqpSolver is not initialized.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)local_20;
    absl::FailedPreconditionError(message);
    absl::StatusOr<double>::StatusOr<absl::Status,_0>((StatusOr<double> *)this,local_20);
    absl::Status::~Status(local_20);
    aVar3 = extraout_XMM0_Qa;
  }
  SVar4.super_StatusOrData<double>.field_1.data_ = aVar3.data_;
  SVar4.super_StatusOrData<double>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<double>_1)this;
  return (StatusOr<double>)SVar4.super_StatusOrData<double>;
}

Assistant:

absl::StatusOr<double> OsqpSolver::GetEpsRel() const {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  return workspace_->settings->eps_rel;
}